

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_14::ConsoleReporter::subcase_end(ConsoleReporter *this)

{
  std::mutex::lock(&this->mutex);
  this->currentSubcaseLevel = this->currentSubcaseLevel - 1;
  this->hasLoggedCurrentTestStart = false;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void subcase_end() override {
            std::lock_guard<std::mutex> lock(mutex);
            --currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }